

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_common.c
# Opt level: O1

void * tree_node_next(void *Node)

{
  void *pvVar1;
  void *pvVar2;
  tree_node *node;
  bool bVar3;
  
  pvVar1 = *(void **)((long)Node + 0x20);
  if (*(void **)((long)Node + 0x20) == (void *)0x0) {
    do {
      pvVar2 = *(void **)((long)Node + 0x10);
      if (pvVar2 == (void *)0x0) {
        return (void *)0x0;
      }
      bVar3 = *(void **)((long)pvVar2 + 0x20) == Node;
      Node = pvVar2;
    } while (bVar3);
  }
  else {
    do {
      pvVar2 = pvVar1;
      pvVar1 = *(void **)((long)pvVar2 + 0x18);
    } while (*(void **)((long)pvVar2 + 0x18) != (void *)0x0);
  }
  return pvVar2;
}

Assistant:

void*
tree_node_next(void* Node)
{
    tree_node* node = Node;
    if (node->rlink)
	return tree_node_min(node->rlink);
    tree_node* parent = node->parent;
    while (parent && parent->rlink == node) {
	node = parent;
	parent = parent->parent;
    }
    return parent;
}